

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::SuperClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *descriptor,Options *options)

{
  char *pcVar1;
  allocator local_9;
  
  if (descriptor[0x24] == (Descriptor)0x0) {
    pcVar1 = "::google::protobuf::Message";
    if (*(int *)(*(long *)(*(long *)(this + 0x10) + 0xa0) + 0xa8) == 3) {
      pcVar1 = "::google::protobuf::MessageLite";
    }
  }
  else {
    pcVar1 = "::google::protobuf::MessageLite";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

string SuperClassName(const Descriptor* descriptor, const Options& options) {
  return HasDescriptorMethods(descriptor->file(), options)
             ? "::google::protobuf::Message"
             : "::google::protobuf::MessageLite";
}